

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O1

void int_rel_half_reif(IntVar *x,IntRelType t,IntVar *y,BoolView *r,int c)

{
  ulong uVar1;
  IntVar *pIVar2;
  IntView<0> y_00;
  IntView<0> y_01;
  IntView<0> y_02;
  IntView<0> x_00;
  IntView<0> x_01;
  IntView<0> x_02;
  undefined1 auStack_48 [24];
  undefined8 uStack_30;
  
  if (IRT_GT < t) {
    uStack_30 = int_rel_reif;
    int_rel_half_reif();
    uStack_30._4_1_ = r->s;
    uStack_30._0_4_ = r->v;
    auStack_48._16_8_ = &PTR_finished_0020fb28;
    auStack_48._0_8_ = x;
    auStack_48._8_4_ = t;
    vec<IRR>::push(&ircs,(IRR *)auStack_48);
    return;
  }
  uVar1 = (ulong)(uint)c;
  pIVar2 = x;
  switch(t) {
  case IRT_EQ:
    y_00._8_8_ = (uVar1 << 0x20) + 1;
    uStack_30._0_4_ = 0x1b3b30;
    uStack_30._4_1_ = false;
    uStack_30._5_3_ = 0;
    y_00.var = y;
    x_00.a = 1;
    x_00.b = 0;
    x_00.var = x;
    newBinGE(x_00,y_00,r);
  case IRT_LE:
    uVar1 = (ulong)(uint)-c;
    break;
  case IRT_NE:
    y_01._8_8_ = (uVar1 << 0x20) + 1;
    y_01.var = y;
    x_01.a = 1;
    x_01.b = 0;
    x_01.var = x;
    newBinNE(x_01,y_01,r);
    return;
  case IRT_LT:
    uVar1 = (ulong)(1 - c);
    break;
  case IRT_GT:
    uVar1 = (ulong)(c + 1);
  case IRT_GE:
    pIVar2 = y;
    y = x;
  }
  y_02._8_8_ = (uVar1 << 0x20) + 1;
  y_02.var = pIVar2;
  x_02.a = 1;
  x_02.b = 0;
  x_02.var = y;
  newBinGE(x_02,y_02,r);
  return;
}

Assistant:

void int_rel_half_reif(IntVar* x, IntRelType t, IntVar* y, const BoolView& r, int c) {
	switch (t) {
		case IRT_EQ:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			break;
		case IRT_NE:
			newBinNE(IntView<>(x), IntView<>(y, 1, c), r);
			break;
		case IRT_LE:
			newBinGE(IntView<>(y), IntView<>(x, 1, -c), r);
			break;
		case IRT_LT:
			newBinGE(IntView<>(y), IntView<>(x, 1, 1 - c), r);
			break;
		case IRT_GE:
			newBinGE(IntView<>(x), IntView<>(y, 1, c), r);
			break;
		case IRT_GT:
			newBinGE(IntView<>(x), IntView<>(y, 1, 1 + c), r);
			break;
		default:
			NEVER;
	}
}